

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGBA,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  EBlend EVar5;
  FSpecialColormap *pFVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  BYTE BVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  BYTE *pBVar17;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0058afdc_caseD_0:
    lVar11 = 0;
    if (count < 1) {
      count = 0;
    }
    pBVar17 = pin + 3;
    for (; count != (int)lVar11; lVar11 = lVar11 + 1) {
      BVar13 = *pBVar17;
      if (BVar13 != '\0') {
        iVar14 = (int)((uint)pBVar17[-3] * inf->alpha + (uint)pout[lVar11 * 4 + 2] * 0x10000) >>
                 0x10;
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pout[lVar11 * 4 + 2] = (BYTE)iVar14;
        iVar14 = (int)((uint)pBVar17[-2] * inf->alpha + (uint)pout[lVar11 * 4 + 1] * 0x10000) >>
                 0x10;
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pout[lVar11 * 4 + 1] = (BYTE)iVar14;
        iVar14 = (int)((uint)pBVar17[-1] * inf->alpha + (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pout[lVar11 * 4] = (BYTE)iVar14;
        pout[lVar11 * 4 + 3] = BVar13;
      }
      pBVar17 = pBVar17 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0058afdc_caseD_0;
    case BLEND_ICEMAP:
      uVar16 = 0;
      uVar10 = (ulong)(uint)count;
      if (count < 1) {
        uVar10 = uVar16;
      }
      for (; (int)uVar10 != (int)uVar16; uVar16 = uVar16 + 1) {
        BVar13 = pin[3];
        if (BVar13 != '\0') {
          iVar14 = cRGBA::Gray(pin);
          iVar14 = iVar14 >> 4;
          iVar8 = (int)((uint)IcePalette[iVar14][0] * inf->alpha +
                       (uint)pout[uVar16 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          pout[uVar16 * 4 + 2] = (BYTE)iVar8;
          iVar8 = (int)((uint)IcePalette[iVar14][1] * inf->alpha +
                       (uint)pout[uVar16 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          pout[uVar16 * 4 + 1] = (BYTE)iVar8;
          iVar14 = (int)((uint)IcePalette[iVar14][2] * inf->alpha + (uint)pout[uVar16 * 4] * 0x10000
                        ) >> 0x10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          pout[uVar16 * 4] = (BYTE)iVar14;
          pout[uVar16 * 4 + 3] = BVar13;
        }
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar11 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar17 = pin + 3;
      for (; count != (int)lVar11; lVar11 = lVar11 + 1) {
        BVar13 = *pBVar17;
        if (BVar13 != '\0') {
          iVar14 = inf->blendcolor[3];
          iVar8 = (int)(((uint)pBVar17[-3] * iVar14 + inf->blendcolor[0] >> 0x10 & 0xff) *
                        inf->alpha + (uint)pout[lVar11 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          bVar1 = pBVar17[-2];
          iVar15 = inf->blendcolor[1];
          bVar2 = pBVar17[-1];
          iVar4 = inf->blendcolor[2];
          pout[lVar11 * 4 + 2] = (BYTE)iVar8;
          iVar8 = (int)(((uint)bVar1 * iVar14 + iVar15 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar11 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          pout[lVar11 * 4 + 1] = (BYTE)iVar8;
          iVar14 = (int)(((uint)bVar2 * iVar14 + iVar4 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          pout[lVar11 * 4] = (BYTE)iVar14;
          pout[lVar11 * 4 + 3] = BVar13;
        }
        pBVar17 = pBVar17 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar11 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar17 = pin + 3;
      for (; count != (int)lVar11; lVar11 = lVar11 + 1) {
        BVar13 = *pBVar17;
        if (BVar13 != '\0') {
          iVar14 = (int)(((uint)pBVar17[-3] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar11 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          bVar1 = pBVar17[-2];
          iVar8 = inf->blendcolor[1];
          bVar2 = pBVar17[-1];
          iVar15 = inf->blendcolor[2];
          pout[lVar11 * 4 + 2] = (BYTE)iVar14;
          iVar14 = (int)(((uint)bVar1 * iVar8 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar11 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          pout[lVar11 * 4 + 1] = (BYTE)iVar14;
          iVar14 = (int)(((uint)bVar2 * iVar15 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          pout[lVar11 * 4] = (BYTE)iVar14;
          pout[lVar11 * 4 + 3] = BVar13;
        }
        pBVar17 = pBVar17 + step;
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar11 = (long)EVar5;
      if (lVar11 < 0x21) {
        if (BLEND_ICEMAP < EVar5) {
          iVar14 = 0x20 - EVar5;
          uVar16 = 0;
          uVar10 = (ulong)(uint)count;
          if (count < 1) {
            uVar10 = uVar16;
          }
          for (; (int)uVar10 != (int)uVar16; uVar16 = uVar16 + 1) {
            bVar1 = pin[3];
            if (bVar1 != 0) {
              iVar8 = cRGBA::Gray(pin);
              iVar8 = iVar8 * (EVar5 + BLEND_MODULATE);
              bVar2 = pin[1];
              bVar3 = pin[2];
              iVar15 = ((int)((uint)*pin * iVar14 + iVar8) / 0x1f & 0xffU) * inf->alpha +
                       (uint)pout[uVar16 * 4 + 2] * 0x10000;
              BVar13 = (BYTE)((uint)iVar15 >> 0x10);
              if (0xfe < iVar15 >> 0x10) {
                BVar13 = 0xff;
              }
              pout[uVar16 * 4 + 2] = BVar13;
              iVar15 = ((int)((uint)bVar2 * iVar14 + iVar8) / 0x1f & 0xffU) * inf->alpha +
                       (uint)pout[uVar16 * 4 + 1] * 0x10000;
              BVar13 = (BYTE)((uint)iVar15 >> 0x10);
              if (0xfe < iVar15 >> 0x10) {
                BVar13 = 0xff;
              }
              pout[uVar16 * 4 + 1] = BVar13;
              iVar8 = ((int)((uint)bVar3 * iVar14 + iVar8) / 0x1f & 0xffU) * inf->alpha +
                      (uint)pout[uVar16 * 4] * 0x10000;
              BVar13 = (BYTE)((uint)iVar8 >> 0x10);
              if (0xfe < iVar8 >> 0x10) {
                BVar13 = 0xff;
              }
              pout[uVar16 * 4] = BVar13;
              pout[uVar16 * 4 + 3] = bVar1;
            }
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar12 = 0; count != (int)lVar12; lVar12 = lVar12 + 1) {
          BVar13 = pin[3];
          if (BVar13 != '\0') {
            uVar7 = cRGBA::Gray(pin);
            uVar9 = 0xff;
            if (uVar7 < 0xff) {
              uVar9 = uVar7;
            }
            if ((int)uVar7 < 1) {
              uVar9 = 0;
            }
            uVar10 = (ulong)uVar9;
            iVar14 = (int)((uint)*(byte *)((long)pFVar6 + uVar10 * 4 + lVar11 * 0x518 + -0xa6fe) *
                           inf->alpha + (uint)pout[lVar12 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            bVar1 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar11 * 0x518 + -0xa700);
            bVar2 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar11 * 0x518 + -0xa6ff);
            pout[lVar12 * 4 + 2] = (BYTE)iVar14;
            iVar14 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar12 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pout[lVar12 * 4 + 1] = (BYTE)iVar14;
            iVar14 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar12 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pout[lVar12 * 4] = (BYTE)iVar14;
            pout[lVar12 * 4 + 3] = BVar13;
          }
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}